

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function-test.c++
# Opt level: O3

void __thiscall kj::anon_unknown_0::TestCase100::run(TestCase100 *this)

{
  int iVar1;
  undefined8 *puVar2;
  long *plVar3;
  long *plVar4;
  long *plVar5;
  Iface *ptrCopy;
  ulong uVar6;
  int local_3c;
  int local_38;
  uint local_34;
  
  local_34 = 0;
  puVar2 = (undefined8 *)operator_new(0x18);
  *puVar2 = &PTR_operator___0043ba28;
  puVar2[1] = &local_34;
  plVar3 = (long *)operator_new(0x18);
  *plVar3 = (long)&PTR_operator___0043ba90;
  plVar3[1] = (long)&local_34;
  local_34 = 3;
  plVar4 = (long *)operator_new(0x10);
  *plVar4 = (long)&PTR_operator___0043bac0;
  plVar4[1] = 10;
  operator_delete(puVar2,0x18);
  iVar1 = (**(code **)*plVar4)(plVar4,0x7b,0x1c8);
  if ((iVar1 != 0x24d) && (_::Debug::minSeverity < 3)) {
    local_3c = 0x24d;
    local_38 = (**(code **)*plVar4)(plVar4,0x7b,0x1c8);
    _::Debug::log<char_const(&)[51],int,int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/function-test.c++"
               ,0x72,ERROR,
               "\"failed: expected \" \"(123 + 456 + 10) == (f(123, 456))\", 123 + 456 + 10, f(123, 456)"
               ,(char (*) [51])"failed: expected (123 + 456 + 10) == (f(123, 456))",&local_3c,
               &local_38);
  }
  iVar1 = (**(code **)*plVar4)(plVar4,7,8);
  if ((iVar1 != 0x1a) && (_::Debug::minSeverity < 3)) {
    local_3c = 0x1a;
    local_38 = (**(code **)*plVar4)(plVar4,7,8);
    _::Debug::log<char_const(&)[43],int,int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/function-test.c++"
               ,0x73,ERROR,
               "\"failed: expected \" \"(7 + 8 + 11) == (f(7, 8))\", 7 + 8 + 11, f(7, 8)",
               (char (*) [43])"failed: expected (7 + 8 + 11) == (f(7, 8))",&local_3c,&local_38);
  }
  iVar1 = (**(code **)*plVar4)(plVar4,2,9);
  if ((iVar1 != 0x17) && (_::Debug::minSeverity < 3)) {
    local_3c = 0x17;
    local_38 = (**(code **)*plVar4)(plVar4,2,9);
    _::Debug::log<char_const(&)[43],int,int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/function-test.c++"
               ,0x74,ERROR,
               "\"failed: expected \" \"(9 + 2 + 12) == (f(2, 9))\", 9 + 2 + 12, f(2, 9)",
               (char (*) [43])"failed: expected (9 + 2 + 12) == (f(2, 9))",&local_3c,&local_38);
  }
  uVar6 = (ulong)local_34;
  plVar5 = (long *)operator_new(0x10);
  *plVar5 = (long)&PTR_operator___0043bb28;
  plVar5[1] = uVar6;
  operator_delete((void *)((long)plVar4 + *(long *)(*plVar4 + -0x10)),0x10);
  local_34 = 0x4d2;
  iVar1 = (**(code **)*plVar5)(plVar5,0x7b,0x1c8);
  if ((iVar1 != 0x246) && (_::Debug::minSeverity < 3)) {
    local_3c = 0x246;
    local_38 = (**(code **)*plVar5)(plVar5,0x7b,0x1c8);
    _::Debug::log<char_const(&)[50],int,int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/function-test.c++"
               ,0x7a,ERROR,
               "\"failed: expected \" \"(123 + 456 + 3) == (f(123, 456))\", 123 + 456 + 3, f(123, 456)"
               ,(char (*) [50])"failed: expected (123 + 456 + 3) == (f(123, 456))",&local_3c,
               &local_38);
  }
  iVar1 = (**(code **)*plVar5)(plVar5,7,8);
  if ((iVar1 != 0x13) && (_::Debug::minSeverity < 3)) {
    local_3c = 0x13;
    local_38 = (**(code **)*plVar5)(plVar5,7,8);
    _::Debug::log<char_const(&)[42],int,int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/function-test.c++"
               ,0x7b,ERROR,"\"failed: expected \" \"(7 + 8 + 4) == (f(7, 8))\", 7 + 8 + 4, f(7, 8)",
               (char (*) [42])"failed: expected (7 + 8 + 4) == (f(7, 8))",&local_3c,&local_38);
  }
  iVar1 = (**(code **)*plVar5)(plVar5,2,9);
  if ((iVar1 != 0x10) && (_::Debug::minSeverity < 3)) {
    local_3c = 0x10;
    local_38 = (**(code **)*plVar5)(plVar5,2,9);
    _::Debug::log<char_const(&)[42],int,int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/function-test.c++"
               ,0x7c,ERROR,"\"failed: expected \" \"(9 + 2 + 5) == (f(2, 9))\", 9 + 2 + 5, f(2, 9)",
               (char (*) [42])"failed: expected (9 + 2 + 5) == (f(2, 9))",&local_3c,&local_38);
  }
  operator_delete((void *)((long)plVar3 + *(long *)(*plVar3 + -0x10)),0x18);
  operator_delete((void *)((long)plVar5 + *(long *)(*plVar5 + -0x10)),0x10);
  return;
}

Assistant:

TEST(ConstFunction, Method) {
  TestConstType obj;
  ConstFunction<int(int, int)> f = KJ_BIND_METHOD(obj, foo);
  ConstFunction<uint(uint, uint)> f2 = KJ_BIND_METHOD(obj, foo);

  EXPECT_EQ(123 + 456, f(123, 456));
  EXPECT_EQ(7 + 8 + 1, f(7, 8));
  EXPECT_EQ(9u + 2u + 2u, f2(2, 9));

  EXPECT_EQ(3, obj.callCount);

  // Bind to a temporary.
  f = KJ_BIND_METHOD(TestConstType(10), foo);

  EXPECT_EQ(123 + 456 + 10, f(123, 456));
  EXPECT_EQ(7 + 8 + 11, f(7, 8));
  EXPECT_EQ(9 + 2 + 12, f(2, 9));

  // Bind to a move.
  f = KJ_BIND_METHOD(kj::mv(obj), foo);
  obj.callCount = 1234;

  EXPECT_EQ(123 + 456 + 3, f(123, 456));
  EXPECT_EQ(7 + 8 + 4, f(7, 8));
  EXPECT_EQ(9 + 2 + 5, f(2, 9));
}